

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalcrules.cpp
# Opt level: O3

void applycalcrule_stepped(profile_rec_new *profile,LossRec *x,int layer,bool isLast)

{
  uchar uVar1;
  pointer ptVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [12];
  pointer ptVar6;
  char cVar7;
  char cVar8;
  uint uVar9;
  OASIS_FLOAT OVar10;
  char cVar23;
  char cVar25;
  char cVar27;
  undefined1 auVar11 [12];
  undefined1 uVar22;
  undefined1 uVar24;
  undefined1 uVar26;
  uint uVar28;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  OASIS_FLOAT OVar29;
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined2 uVar35;
  float fVar37;
  float fVar38;
  undefined1 auVar42 [12];
  undefined1 auVar50 [16];
  undefined1 auVar53 [16];
  undefined1 auVar43 [12];
  undefined2 uVar61;
  undefined1 auVar44 [12];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar60 [16];
  float fVar62;
  OASIS_FLOAT OVar63;
  char cVar84;
  undefined1 auVar64 [12];
  char cVar82;
  char cVar83;
  undefined1 auVar65 [16];
  undefined1 auVar70 [16];
  undefined1 auVar75 [16];
  undefined1 auVar80 [16];
  OASIS_FLOAT OVar85;
  undefined1 auVar86 [12];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar87 [12];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar88 [12];
  undefined1 auVar99 [16];
  undefined1 auVar89 [12];
  undefined1 auVar101 [16];
  float fVar102;
  float fVar103;
  float fVar104;
  undefined4 uVar36;
  undefined6 uVar39;
  undefined8 uVar40;
  undefined1 auVar41 [12];
  undefined1 auVar47 [14];
  undefined1 auVar52 [16];
  undefined1 auVar48 [14];
  undefined1 auVar55 [16];
  undefined1 auVar49 [14];
  undefined1 auVar59 [16];
  undefined1 auVar51 [16];
  undefined1 auVar54 [16];
  undefined1 auVar58 [16];
  undefined1 auVar66 [16];
  undefined1 auVar71 [16];
  undefined1 auVar76 [16];
  undefined1 auVar67 [16];
  undefined1 auVar72 [16];
  undefined1 auVar77 [16];
  undefined1 auVar68 [16];
  undefined1 auVar73 [16];
  undefined1 auVar78 [16];
  undefined1 auVar69 [16];
  undefined1 auVar74 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar91 [16];
  undefined1 auVar94 [16];
  undefined1 auVar98 [16];
  undefined1 auVar100 [16];
  
  uVar9 = profile->calcrule_id;
  switch(uVar9) {
  case 0xc:
    fVar37 = x->loss;
    if (0.0 < fVar37) {
      for (ptVar6 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_start;
          ptVar6 != (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_finish; ptVar6 = ptVar6 + 1) {
        if (ptVar6->tc_id == '\0') {
          fVar38 = fVar37 - ptVar6->tc_val;
          fVar34 = 0.0;
          if (0.0 <= fVar38) {
            fVar34 = fVar38;
          }
          fVar38 = x->effective_deductible + (fVar37 - fVar34);
          x->effective_deductible = fVar38;
          if (x->under_limit <= fVar38 && fVar38 != x->under_limit) {
            x->under_limit = fVar38;
          }
          x->retained_loss = (fVar37 - fVar34) + x->retained_loss;
          x->loss = fVar34;
          return;
        }
      }
    }
    break;
  case 0xd:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x21:
  case 0x23:
  case 0x24:
switchD_0010c310_caseD_d:
    fprintf(_stderr,"FATAL: Unknown calc rule %d\n",(ulong)uVar9);
    return;
  case 0xe:
    OVar29 = 0.0;
    for (ptVar6 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ptVar6 != (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_finish; ptVar6 = ptVar6 + 1) {
      if (ptVar6->tc_id == '\x04') {
        OVar29 = ptVar6->tc_val;
      }
    }
    fVar33 = x->loss;
    fVar34 = fVar33;
    if (OVar29 < fVar33) {
      x->over_limit = fVar33 - OVar29;
      fVar34 = OVar29;
    }
    fVar37 = x->effective_deductible;
    if (x->effective_deductible <= x->under_limit) {
      fVar37 = x->under_limit;
    }
    fVar38 = OVar29 - fVar34;
    if (fVar37 <= OVar29 - fVar34) {
      fVar38 = fVar37;
    }
    x->under_limit = fVar38;
joined_r0x0010cf0b:
    if (layer < 2) {
      OVar29 = (fVar33 - fVar34) + x->retained_loss;
    }
    else {
      OVar29 = x->previous_layer_retained_loss - fVar34;
    }
    x->retained_loss = OVar29;
    x->loss = fVar34;
    return;
  case 0x1b:
    ptVar6 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar2 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (ptVar6 == ptVar2) {
      fVar37 = x->accumulated_tiv;
      fVar31 = x->loss / fVar37;
      fVar32 = 1.0;
      auVar12 = ZEXT816(0);
      fVar62 = 0.0;
      fVar33 = 0.0;
      fVar103 = 0.0;
      fVar38 = 0.0;
      auVar101 = ZEXT816(0);
      fVar34 = 0.0;
LAB_0010cd2b:
      fVar102 = 0.0;
      if (fVar31 < fVar33) goto LAB_0010cd35;
    }
    else {
      auVar12 = ZEXT816(0);
      auVar19 = ZEXT816(0);
      do {
        uVar36 = *(undefined4 *)&ptVar6->tc_id;
        uVar26 = (undefined1)((uint)uVar36 >> 0x18);
        uVar24 = (undefined1)((uint)uVar36 >> 0x10);
        uVar22 = (undefined1)((uint)uVar36 >> 8);
        auVar56._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar26,uVar26),uVar24),CONCAT14(uVar24,uVar36)) >>
                  0x20);
        auVar56[3] = uVar22;
        auVar56[2] = uVar22;
        auVar56[0] = (undefined1)uVar36;
        auVar56[1] = auVar56[0];
        auVar56._8_8_ = 0;
        auVar57 = pshuflw(auVar56,auVar56,0);
        uVar35 = CONCAT11(-(auVar57[0] == '\0'),-(auVar57[0] == '\0'));
        uVar36 = CONCAT13(-(auVar57[1] == '\t'),CONCAT12(-(auVar57[1] == '\t'),uVar35));
        uVar39 = CONCAT15(-(auVar57[2] == '\n'),CONCAT14(-(auVar57[2] == '\n'),uVar36));
        uVar40 = CONCAT17(-(auVar57[3] == '\v'),CONCAT16(-(auVar57[3] == '\v'),uVar39));
        auVar45._0_10_ = CONCAT19(-(auVar57[4] == '\r'),CONCAT18(-(auVar57[4] == '\r'),uVar40));
        auVar45[10] = -(auVar57[5] == '\x0e');
        auVar45[0xb] = -(auVar57[5] == '\x0e');
        auVar49[0xc] = -(auVar57[6] == '\x04');
        auVar49._0_12_ = auVar45;
        auVar49[0xd] = -(auVar57[6] == '\x04');
        auVar58[0xe] = -(auVar57[7] == '\x05');
        auVar58._0_14_ = auVar49;
        auVar58[0xf] = -(auVar57[7] == '\x05');
        uVar61 = (undefined2)((ulong)uVar40 >> 0x30);
        auVar79._12_2_ = uVar61;
        auVar79._0_12_ = auVar45;
        auVar79._14_2_ = uVar61;
        uVar61 = (undefined2)((uint6)uVar39 >> 0x20);
        auVar78._12_4_ = auVar79._12_4_;
        auVar78._10_2_ = uVar61;
        auVar78._0_10_ = auVar45._0_10_;
        auVar77._10_6_ = auVar78._10_6_;
        auVar77._8_2_ = uVar61;
        auVar77._0_8_ = uVar40;
        uVar61 = (undefined2)((uint)uVar36 >> 0x10);
        auVar76._8_8_ = auVar77._8_8_;
        auVar76._6_2_ = uVar61;
        auVar76._0_6_ = uVar39;
        auVar75._6_10_ = auVar76._6_10_;
        auVar75._4_2_ = uVar61;
        auVar75._0_4_ = uVar36;
        uVar61 = (undefined2)((unkuint10)auVar45._0_10_ >> 0x40);
        uVar9 = CONCAT22(uVar61,uVar61);
        auVar46._0_8_ = CONCAT26(auVar45._10_2_,CONCAT24(auVar45._10_2_,uVar9));
        auVar46._8_2_ = auVar49._12_2_;
        auVar46._10_2_ = auVar49._12_2_;
        auVar59._14_2_ = auVar58._14_2_;
        auVar59._12_2_ = auVar59._14_2_;
        auVar59._0_12_ = auVar46;
        OVar29 = ptVar6->tc_val;
        uVar28 = (uint)((ulong)auVar46._0_8_ >> 0x20);
        auVar18._4_4_ = ~uVar28 & auVar19._4_4_;
        auVar18._0_4_ = ~uVar9 & auVar19._0_4_;
        auVar18._8_4_ = ~auVar46._8_4_ & auVar19._8_4_;
        auVar18._12_4_ = ~auVar59._12_4_ & auVar19._12_4_;
        auVar19._4_4_ = (uint)OVar29 & uVar28;
        auVar19._0_4_ = (uint)OVar29 & uVar9;
        auVar19._8_4_ = (uint)OVar29 & auVar46._8_4_;
        auVar19._12_4_ = (uint)OVar29 & auVar59._12_4_;
        auVar19 = auVar18 | auVar19;
        auVar95._0_4_ = (uint)OVar29 & CONCAT22(uVar35,uVar35);
        auVar95._4_4_ = (uint)OVar29 & auVar75._4_4_;
        auVar95._8_4_ = (uint)OVar29 & auVar77._8_4_;
        auVar95._12_4_ = (uint)OVar29 & auVar78._12_4_;
        auVar30._4_4_ = ~auVar75._4_4_ & auVar12._4_4_;
        auVar30._0_4_ = ~CONCAT22(uVar35,uVar35) & auVar12._0_4_;
        auVar30._8_4_ = ~auVar77._8_4_ & auVar12._8_4_;
        auVar30._12_4_ = ~auVar78._12_4_ & auVar12._12_4_;
        auVar12 = auVar30 | auVar95;
        ptVar6 = ptVar6 + 1;
      } while (ptVar6 != ptVar2);
      fVar38 = auVar19._4_4_;
      fVar34 = auVar19._12_4_;
      fVar32 = auVar19._0_4_ + 1.0;
      fVar37 = x->accumulated_tiv;
      fVar31 = x->loss / fVar37;
      fVar33 = auVar12._8_4_;
      fVar62 = auVar12._4_4_;
      fVar103 = auVar12._12_4_;
      auVar5._4_8_ = auVar95._8_8_;
      auVar5._0_4_ = fVar38;
      auVar96._0_8_ = auVar5._0_8_ << 0x20;
      auVar96._8_4_ = auVar19._8_4_;
      auVar96._12_4_ = fVar34;
      auVar101._8_8_ = auVar19._8_8_;
      auVar101._0_8_ = auVar96._8_8_;
      if ((fVar33 != 1.0) || (NAN(fVar33))) goto LAB_0010cd2b;
LAB_0010cd35:
      fVar102 = 0.0;
      if (fVar62 <= fVar31) {
        fVar62 = fVar103 * fVar37 - auVar12._0_4_;
        fVar37 = 0.0;
        if (0.0 <= fVar62) {
          fVar37 = fVar62;
        }
        if (fVar37 <= auVar101._0_4_) {
          auVar101._0_4_ = fVar37;
        }
        fVar38 = fVar38 * auVar101._0_4_;
        if (fVar38 <= fVar34) {
          fVar34 = fVar38;
        }
        fVar102 = fVar32 * (fVar34 + auVar101._0_4_);
      }
    }
    if (profile->step_id != 1) {
      fVar102 = fVar102 + x->step_loss;
    }
    x->step_loss = fVar102;
    if (isLast) {
      x->loss = fVar102;
      return;
    }
    break;
  case 0x1c:
    ptVar6 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar2 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (ptVar6 == ptVar2) {
      fVar37 = x->loss;
      fVar102 = fVar37 / x->accumulated_tiv;
      fVar103 = 1.0;
      fVar38 = 0.0;
      fVar62 = 0.0;
      fVar33 = 0.0;
      fVar34 = 0.0;
      fVar32 = 0.0;
      fVar31 = 0.0;
LAB_0010cda9:
      fVar104 = 0.0;
      if (fVar102 < fVar31) goto LAB_0010cdb1;
    }
    else {
      fVar38 = 0.0;
      fVar62 = 0.0;
      fVar34 = 0.0;
      fVar33 = 0.0;
      fVar32 = 0.0;
      fVar31 = 0.0;
      fVar37 = 0.0;
      do {
        OVar29 = ptVar6->tc_val;
        uVar36 = *(undefined4 *)&ptVar6->tc_id;
        cVar7 = (char)uVar36;
        OVar10 = OVar29;
        if (cVar7 != '\n') {
          OVar10 = fVar31;
        }
        fVar31 = OVar10;
        OVar10 = OVar29;
        if (cVar7 != '\v') {
          OVar10 = fVar32;
        }
        fVar32 = OVar10;
        OVar10 = OVar29;
        if (cVar7 != '\r') {
          OVar10 = fVar37;
        }
        uVar26 = (undefined1)((uint)uVar36 >> 0x18);
        uVar24 = (undefined1)((uint)uVar36 >> 0x10);
        uVar22 = (undefined1)((uint)uVar36 >> 8);
        auVar97._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar26,uVar26),uVar24),CONCAT14(uVar24,uVar36)) >>
                  0x20);
        auVar97[3] = uVar22;
        auVar97[2] = uVar22;
        auVar97[1] = cVar7;
        auVar97[0] = cVar7;
        auVar97._8_8_ = 0;
        auVar12 = pshuflw(auVar97,auVar97,0);
        cVar27 = auVar12[3];
        cVar25 = auVar12[2];
        cVar23 = auVar12[1];
        cVar7 = auVar12[0];
        uVar9 = CONCAT13(-(cVar7 == '\0'),
                         CONCAT12(-(cVar7 == '\0'),CONCAT11(-(cVar7 == '\0'),-(cVar7 == '\0'))));
        auVar88._0_8_ =
             CONCAT17(-(cVar23 == '\t'),
                      CONCAT16(-(cVar23 == '\t'),
                               CONCAT15(-(cVar23 == '\t'),CONCAT14(-(cVar23 == '\t'),uVar9))));
        auVar88[8] = -(cVar25 == '\x05');
        auVar88[9] = -(cVar25 == '\x05');
        auVar88[10] = -(cVar25 == '\x05');
        auVar88[0xb] = -(cVar25 == '\x05');
        auVar98[0xc] = -(cVar27 == '\x0e');
        auVar98._0_12_ = auVar88;
        auVar98[0xd] = -(cVar27 == '\x0e');
        auVar98[0xe] = -(cVar27 == '\x0e');
        auVar98[0xf] = -(cVar27 == '\x0e');
        uVar28 = (uint)((ulong)auVar88._0_8_ >> 0x20);
        fVar38 = (float)(~uVar9 & (uint)fVar38 | (uint)OVar29 & uVar9);
        fVar62 = (float)(~uVar28 & (uint)fVar62 | (uint)OVar29 & uVar28);
        fVar34 = (float)(~auVar88._8_4_ & (uint)fVar34 | (uint)OVar29 & auVar88._8_4_);
        fVar33 = (float)(~auVar98._12_4_ & (uint)fVar33 | (uint)OVar29 & auVar98._12_4_);
        ptVar6 = ptVar6 + 1;
        fVar37 = OVar10;
      } while (ptVar6 != ptVar2);
      fVar103 = OVar10 + 1.0;
      fVar37 = x->loss;
      fVar102 = fVar37 / x->accumulated_tiv;
      if ((fVar31 != 1.0) || (NAN(fVar31))) goto LAB_0010cda9;
LAB_0010cdb1:
      fVar104 = 0.0;
      if (fVar62 <= fVar102) {
        fVar38 = fVar32 * fVar37 - fVar38;
        fVar37 = 0.0;
        if (0.0 <= fVar38) {
          fVar37 = fVar38;
        }
        if (fVar33 * fVar37 <= fVar34) {
          fVar34 = fVar33 * fVar37;
        }
        fVar104 = fVar103 * (fVar34 + fVar37);
      }
    }
    if (profile->step_id != 1) {
      fVar104 = fVar104 + x->step_loss;
    }
    x->step_loss = fVar104;
    if (isLast) {
      x->loss = fVar104;
      return;
    }
    break;
  case 0x1d:
    ptVar6 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar2 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (ptVar6 == ptVar2) {
      fVar34 = x->accumulated_tiv;
      fVar31 = x->loss / fVar34;
      fVar62 = 1.0;
      auVar14 = ZEXT816(0);
      fVar37 = 0.0;
      fVar38 = 0.0;
      OVar29 = 0.0;
      fVar33 = 0.0;
      fVar103 = 0.0;
LAB_0010ccb1:
      fVar32 = 0.0;
      if (OVar29 <= fVar31) goto LAB_0010cce2;
    }
    else {
      auVar14 = ZEXT816(0);
      auVar12 = ZEXT416(0xb0d0e05);
      cVar27 = auVar12[3];
      cVar25 = auVar12[2];
      cVar23 = auVar12[1];
      cVar7 = auVar12[0];
      fVar33 = 0.0;
      fVar103 = 0.0;
      fVar37 = 0.0;
      do {
        OVar10 = ptVar6->tc_val;
        uVar36 = *(undefined4 *)&ptVar6->tc_id;
        cVar8 = (char)uVar36;
        OVar29 = OVar10;
        if (cVar8 != '\0') {
          OVar29 = fVar103;
        }
        fVar103 = OVar29;
        OVar29 = OVar10;
        if (cVar8 != '\t') {
          OVar29 = fVar33;
        }
        fVar33 = OVar29;
        OVar29 = OVar10;
        if (cVar8 != '\n') {
          OVar29 = fVar37;
        }
        uVar26 = (undefined1)((uint)uVar36 >> 0x18);
        uVar24 = (undefined1)((uint)uVar36 >> 0x10);
        uVar22 = (undefined1)((uint)uVar36 >> 8);
        auVar93._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar26,uVar26),uVar24),CONCAT14(uVar24,uVar36)) >>
                  0x20);
        auVar93[3] = uVar22;
        auVar93[2] = uVar22;
        auVar93[1] = cVar8;
        auVar93[0] = cVar8;
        auVar93._8_8_ = 0;
        auVar12 = pshuflw(auVar93,auVar93,0);
        cVar84 = auVar12[3];
        cVar83 = auVar12[2];
        cVar82 = auVar12[1];
        cVar8 = auVar12[0];
        uVar9 = CONCAT13(-(cVar8 == cVar7),
                         CONCAT12(-(cVar8 == cVar7),CONCAT11(-(cVar8 == cVar7),-(cVar8 == cVar7))));
        auVar87._0_8_ =
             CONCAT17(-(cVar82 == cVar23),
                      CONCAT16(-(cVar82 == cVar23),
                               CONCAT15(-(cVar82 == cVar23),CONCAT14(-(cVar82 == cVar23),uVar9))));
        auVar87[8] = -(cVar83 == cVar25);
        auVar87[9] = -(cVar83 == cVar25);
        auVar87[10] = -(cVar83 == cVar25);
        auVar87[0xb] = -(cVar83 == cVar25);
        auVar94[0xc] = -(cVar84 == cVar27);
        auVar94._0_12_ = auVar87;
        auVar94[0xd] = -(cVar84 == cVar27);
        auVar94[0xe] = -(cVar84 == cVar27);
        auVar94[0xf] = -(cVar84 == cVar27);
        uVar28 = (uint)((ulong)auVar87._0_8_ >> 0x20);
        auVar17._4_4_ = ~uVar28 & auVar14._4_4_;
        auVar17._0_4_ = ~uVar9 & auVar14._0_4_;
        auVar17._8_4_ = ~auVar87._8_4_ & auVar14._8_4_;
        auVar17._12_4_ = ~auVar94._12_4_ & auVar14._12_4_;
        auVar4._4_4_ = (uint)OVar10 & uVar28;
        auVar4._0_4_ = (uint)OVar10 & uVar9;
        auVar4._8_4_ = (uint)OVar10 & auVar87._8_4_;
        auVar4._12_4_ = (uint)OVar10 & auVar94._12_4_;
        auVar14 = auVar17 | auVar4;
        ptVar6 = ptVar6 + 1;
        fVar37 = OVar29;
      } while (ptVar6 != ptVar2);
      fVar37 = auVar14._4_4_;
      fVar38 = auVar14._12_4_;
      fVar62 = auVar14._8_4_ + 1.0;
      fVar34 = x->accumulated_tiv;
      fVar31 = x->loss / fVar34;
      if ((OVar29 != 1.0) || (NAN(OVar29))) goto LAB_0010ccb1;
    }
    fVar32 = 0.0;
    if (fVar33 <= fVar31) {
      fVar103 = fVar38 * fVar34 - fVar103;
      fVar33 = 0.0;
      if (0.0 <= fVar103) {
        fVar33 = fVar103;
      }
LAB_0010cccf:
      if (fVar37 * fVar33 <= auVar14._0_4_) {
        auVar14._0_4_ = fVar37 * fVar33;
      }
      fVar32 = fVar62 * (auVar14._0_4_ + fVar33);
    }
    goto LAB_0010cce2;
  case 0x1e:
    ptVar6 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar2 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (ptVar6 == ptVar2) {
      fVar102 = x->loss / x->accumulated_tiv;
      fVar62 = 1.0;
      fVar37 = 0.0;
      fVar34 = 0.0;
      fVar38 = 0.0;
      fVar33 = 0.0;
      fVar32 = 0.0;
      fVar31 = 0.0;
      fVar103 = 0.0;
LAB_0010cbb9:
      fVar104 = 0.0;
      if ((fVar102 < fVar32) && (fVar31 <= fVar102)) {
        fVar103 = fVar33 * fVar34 - fVar103;
        fVar34 = 0.0;
        if (0.0 <= fVar103) {
          fVar34 = fVar103;
        }
        if (fVar38 * fVar34 <= fVar37) {
          fVar37 = fVar38 * fVar34;
        }
        fVar37 = fVar37 + fVar34;
LAB_0010cbe2:
        fVar104 = fVar62 * fVar37;
      }
    }
    else {
      fVar37 = 0.0;
      fVar34 = 0.0;
      fVar38 = 0.0;
      fVar62 = 0.0;
      fVar33 = 0.0;
      fVar32 = 0.0;
      fVar31 = 0.0;
      fVar103 = 0.0;
      do {
        uVar36 = *(undefined4 *)&ptVar6->tc_id;
        uVar26 = (undefined1)((uint)uVar36 >> 0x18);
        uVar24 = (undefined1)((uint)uVar36 >> 0x10);
        uVar22 = (undefined1)((uint)uVar36 >> 8);
        auVar50._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar26,uVar26),uVar24),CONCAT14(uVar24,uVar36)) >>
                  0x20);
        auVar50[3] = uVar22;
        auVar50[2] = uVar22;
        auVar50[0] = (undefined1)uVar36;
        auVar50[1] = auVar50[0];
        auVar50._8_8_ = 0;
        auVar12 = pshuflw(auVar50,auVar50,0);
        uVar35 = CONCAT11(-(auVar12[0] == '\x05'),-(auVar12[0] == '\x05'));
        uVar36 = CONCAT13(-(auVar12[1] == '\x04'),CONCAT12(-(auVar12[1] == '\x04'),uVar35));
        uVar39 = CONCAT15(-(auVar12[2] == '\x0e'),CONCAT14(-(auVar12[2] == '\x0e'),uVar36));
        uVar40 = CONCAT17(-(auVar12[3] == '\r'),CONCAT16(-(auVar12[3] == '\r'),uVar39));
        auVar41._0_10_ = CONCAT19(-(auVar12[4] == '\v'),CONCAT18(-(auVar12[4] == '\v'),uVar40));
        auVar41[10] = -(auVar12[5] == '\n');
        auVar41[0xb] = -(auVar12[5] == '\n');
        auVar47[0xc] = -(auVar12[6] == '\t');
        auVar47._0_12_ = auVar41;
        auVar47[0xd] = -(auVar12[6] == '\t');
        auVar51[0xe] = -(auVar12[7] == '\0');
        auVar51._0_14_ = auVar47;
        auVar51[0xf] = -(auVar12[7] == '\0');
        uVar61 = (undefined2)((ulong)uVar40 >> 0x30);
        auVar69._12_2_ = uVar61;
        auVar69._0_12_ = auVar41;
        auVar69._14_2_ = uVar61;
        uVar61 = (undefined2)((uint6)uVar39 >> 0x20);
        auVar68._12_4_ = auVar69._12_4_;
        auVar68._10_2_ = uVar61;
        auVar68._0_10_ = auVar41._0_10_;
        auVar67._10_6_ = auVar68._10_6_;
        auVar67._8_2_ = uVar61;
        auVar67._0_8_ = uVar40;
        uVar61 = (undefined2)((uint)uVar36 >> 0x10);
        auVar66._8_8_ = auVar67._8_8_;
        auVar66._6_2_ = uVar61;
        auVar66._0_6_ = uVar39;
        auVar65._6_10_ = auVar66._6_10_;
        auVar65._4_2_ = uVar61;
        auVar65._0_4_ = uVar36;
        uVar61 = (undefined2)((unkuint10)auVar41._0_10_ >> 0x40);
        uVar9 = CONCAT22(uVar61,uVar61);
        auVar42._0_8_ = CONCAT26(auVar41._10_2_,CONCAT24(auVar41._10_2_,uVar9));
        auVar42._8_2_ = auVar47._12_2_;
        auVar42._10_2_ = auVar47._12_2_;
        auVar52._14_2_ = auVar51._14_2_;
        auVar52._12_2_ = auVar52._14_2_;
        auVar52._0_12_ = auVar42;
        OVar29 = ptVar6->tc_val;
        uVar28 = (uint)((ulong)auVar42._0_8_ >> 0x20);
        fVar33 = (float)(~uVar9 & (uint)fVar33 | (uint)OVar29 & uVar9);
        fVar32 = (float)(~uVar28 & (uint)fVar32 | (uint)OVar29 & uVar28);
        fVar31 = (float)(~auVar42._8_4_ & (uint)fVar31 | (uint)OVar29 & auVar42._8_4_);
        fVar103 = (float)(~auVar52._12_4_ & (uint)fVar103 | (uint)OVar29 & auVar52._12_4_);
        fVar37 = (float)(~CONCAT22(uVar35,uVar35) & (uint)fVar37 |
                        (uint)OVar29 & CONCAT22(uVar35,uVar35));
        fVar34 = (float)(~auVar65._4_4_ & (uint)fVar34 | (uint)OVar29 & auVar65._4_4_);
        fVar38 = (float)(~auVar67._8_4_ & (uint)fVar38 | (uint)OVar29 & auVar67._8_4_);
        fVar62 = (float)(~auVar68._12_4_ & (uint)fVar62 | (uint)OVar29 & auVar68._12_4_);
        ptVar6 = ptVar6 + 1;
      } while (ptVar6 != ptVar2);
      fVar62 = fVar62 + 1.0;
      fVar102 = x->loss / x->accumulated_tiv;
      if ((fVar32 != 1.0) || (NAN(fVar32))) goto LAB_0010cbb9;
      fVar104 = 0.0;
      if (fVar31 <= fVar102) {
        fVar103 = fVar34 * fVar33 - fVar103;
        fVar34 = 0.0;
        if (0.0 <= fVar103) {
          fVar34 = fVar103;
        }
        if (fVar38 * fVar34 <= fVar37) {
          fVar37 = fVar38 * fVar34;
        }
        fVar37 = fVar37 + fVar34;
        goto LAB_0010cbe2;
      }
    }
    if (profile->step_id != 1) {
      fVar104 = fVar104 + x->step_loss;
    }
    x->step_loss = fVar104;
    if (isLast) {
      x->loss = fVar104;
      return;
    }
    break;
  case 0x1f:
    ptVar6 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar2 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (ptVar6 == ptVar2) {
      fVar103 = x->loss / x->accumulated_tiv;
      fVar62 = 1.0;
      auVar14 = ZEXT816(0);
      fVar37 = 0.0;
      fVar34 = 0.0;
      OVar29 = 0.0;
      fVar33 = 0.0;
      fVar38 = 0.0;
LAB_0010cb6d:
      fVar32 = 0.0;
      if (fVar103 < OVar29) goto LAB_0010cb79;
    }
    else {
      auVar14 = ZEXT816(0);
      auVar12 = ZEXT416(0xb0d0e05);
      cVar27 = auVar12[3];
      cVar25 = auVar12[2];
      cVar23 = auVar12[1];
      cVar7 = auVar12[0];
      fVar33 = 0.0;
      fVar38 = 0.0;
      fVar37 = 0.0;
      do {
        OVar10 = ptVar6->tc_val;
        uVar36 = *(undefined4 *)&ptVar6->tc_id;
        cVar8 = (char)uVar36;
        OVar29 = OVar10;
        if (cVar8 != '\0') {
          OVar29 = fVar38;
        }
        fVar38 = OVar29;
        OVar29 = OVar10;
        if (cVar8 != '\t') {
          OVar29 = fVar33;
        }
        fVar33 = OVar29;
        OVar29 = OVar10;
        if (cVar8 != '\n') {
          OVar29 = fVar37;
        }
        uVar26 = (undefined1)((uint)uVar36 >> 0x18);
        uVar24 = (undefined1)((uint)uVar36 >> 0x10);
        uVar22 = (undefined1)((uint)uVar36 >> 8);
        auVar90._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar26,uVar26),uVar24),CONCAT14(uVar24,uVar36)) >>
                  0x20);
        auVar90[3] = uVar22;
        auVar90[2] = uVar22;
        auVar90[1] = cVar8;
        auVar90[0] = cVar8;
        auVar90._8_8_ = 0;
        auVar12 = pshuflw(auVar90,auVar90,0);
        cVar84 = auVar12[3];
        cVar83 = auVar12[2];
        cVar82 = auVar12[1];
        cVar8 = auVar12[0];
        uVar9 = CONCAT13(-(cVar8 == cVar7),
                         CONCAT12(-(cVar8 == cVar7),CONCAT11(-(cVar8 == cVar7),-(cVar8 == cVar7))));
        auVar86._0_8_ =
             CONCAT17(-(cVar82 == cVar23),
                      CONCAT16(-(cVar82 == cVar23),
                               CONCAT15(-(cVar82 == cVar23),CONCAT14(-(cVar82 == cVar23),uVar9))));
        auVar86[8] = -(cVar83 == cVar25);
        auVar86[9] = -(cVar83 == cVar25);
        auVar86[10] = -(cVar83 == cVar25);
        auVar86[0xb] = -(cVar83 == cVar25);
        auVar91[0xc] = -(cVar84 == cVar27);
        auVar91._0_12_ = auVar86;
        auVar91[0xd] = -(cVar84 == cVar27);
        auVar91[0xe] = -(cVar84 == cVar27);
        auVar91[0xf] = -(cVar84 == cVar27);
        uVar28 = (uint)((ulong)auVar86._0_8_ >> 0x20);
        auVar13._4_4_ = ~uVar28 & auVar14._4_4_;
        auVar13._0_4_ = ~uVar9 & auVar14._0_4_;
        auVar13._8_4_ = ~auVar86._8_4_ & auVar14._8_4_;
        auVar13._12_4_ = ~auVar91._12_4_ & auVar14._12_4_;
        auVar3._4_4_ = (uint)OVar10 & uVar28;
        auVar3._0_4_ = (uint)OVar10 & uVar9;
        auVar3._8_4_ = (uint)OVar10 & auVar86._8_4_;
        auVar3._12_4_ = (uint)OVar10 & auVar91._12_4_;
        auVar14 = auVar13 | auVar3;
        ptVar6 = ptVar6 + 1;
        fVar37 = OVar29;
      } while (ptVar6 != ptVar2);
      fVar37 = auVar14._4_4_;
      fVar34 = auVar14._12_4_;
      fVar62 = auVar14._8_4_ + 1.0;
      fVar103 = x->loss / x->accumulated_tiv;
      if ((OVar29 != 1.0) || (NAN(OVar29))) goto LAB_0010cb6d;
LAB_0010cb79:
      fVar32 = 0.0;
      if (fVar33 <= fVar103) {
        fVar33 = 0.0;
        if (0.0 <= fVar34 - fVar38) {
          fVar33 = fVar34 - fVar38;
        }
        goto LAB_0010cccf;
      }
    }
LAB_0010cce2:
    if (profile->step_id != 1) {
      fVar32 = fVar32 + x->step_loss;
    }
    x->step_loss = fVar32;
    if (isLast) {
      x->loss = fVar32;
      return;
    }
    break;
  case 0x20:
    ptVar6 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar2 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    OVar10 = 0.0;
    fVar38 = 0.0;
    fVar34 = 0.0;
    fVar62 = 0.0;
    fVar37 = 0.0;
    if (ptVar6 == ptVar2) {
      fVar103 = 1.0;
      fVar33 = 0.0;
    }
    else {
      fVar103 = 0.0;
      OVar29 = 0.0;
      do {
        OVar63 = ptVar6->tc_val;
        uVar36 = *(undefined4 *)&ptVar6->tc_id;
        cVar7 = (char)uVar36;
        OVar85 = OVar63;
        if (cVar7 != '\r') {
          OVar85 = fVar103;
        }
        fVar103 = OVar85;
        fVar33 = OVar63;
        if (cVar7 != '\x05') {
          fVar33 = OVar29;
        }
        uVar26 = (undefined1)((uint)uVar36 >> 0x18);
        uVar24 = (undefined1)((uint)uVar36 >> 0x10);
        uVar22 = (undefined1)((uint)uVar36 >> 8);
        auVar99._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar26,uVar26),uVar24),CONCAT14(uVar24,uVar36)) >>
                  0x20);
        auVar99[3] = uVar22;
        auVar99[2] = uVar22;
        auVar99[1] = cVar7;
        auVar99[0] = cVar7;
        auVar99._8_8_ = 0;
        auVar12 = pshuflw(auVar99,auVar99,0);
        cVar27 = auVar12[3];
        cVar25 = auVar12[2];
        cVar23 = auVar12[1];
        cVar7 = auVar12[0];
        uVar9 = CONCAT13(-(cVar7 == '\t'),
                         CONCAT12(-(cVar7 == '\t'),CONCAT11(-(cVar7 == '\t'),-(cVar7 == '\t'))));
        auVar89._0_8_ =
             CONCAT17(-(cVar23 == '\v'),
                      CONCAT16(-(cVar23 == '\v'),
                               CONCAT15(-(cVar23 == '\v'),CONCAT14(-(cVar23 == '\v'),uVar9))));
        auVar89[8] = -(cVar25 == '\x0e');
        auVar89[9] = -(cVar25 == '\x0e');
        auVar89[10] = -(cVar25 == '\x0e');
        auVar89[0xb] = -(cVar25 == '\x0e');
        auVar100[0xc] = -(cVar27 == '\x04');
        auVar100._0_12_ = auVar89;
        auVar100[0xd] = -(cVar27 == '\x04');
        auVar100[0xe] = -(cVar27 == '\x04');
        auVar100[0xf] = -(cVar27 == '\x04');
        uVar28 = (uint)((ulong)auVar89._0_8_ >> 0x20);
        fVar38 = (float)(~uVar9 & (uint)fVar38 | (uint)OVar63 & uVar9);
        fVar34 = (float)(~uVar28 & (uint)fVar34 | (uint)OVar63 & uVar28);
        fVar62 = (float)(~auVar89._8_4_ & (uint)fVar62 | (uint)OVar63 & auVar89._8_4_);
        fVar37 = (float)(~auVar100._12_4_ & (uint)fVar37 | (uint)OVar63 & auVar100._12_4_);
        ptVar6 = ptVar6 + 1;
        OVar29 = fVar33;
      } while (ptVar6 != ptVar2);
      fVar103 = fVar103 + 1.0;
    }
    if (fVar38 <= x->loss) {
      fVar34 = fVar34 * x->loss;
      if (fVar34 <= fVar37) {
        fVar37 = fVar34;
      }
      if (fVar62 * fVar37 <= fVar33) {
        fVar33 = fVar62 * fVar37;
      }
      OVar10 = fVar103 * (fVar33 + fVar37);
    }
    if (profile->step_id != 1) {
      OVar10 = OVar10 + x->step_loss;
    }
    x->step_loss = OVar10;
    if (isLast) goto LAB_0010ce4a;
    break;
  case 0x22:
    ptVar6 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar2 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    fVar37 = 0.0;
    OVar10 = 0.0;
    OVar29 = 0.0;
    if (ptVar6 != ptVar2) {
      fVar37 = 0.0;
      OVar63 = 0.0;
      OVar85 = 0.0;
      do {
        OVar29 = ptVar6->tc_val;
        uVar1 = ptVar6->tc_id;
        OVar10 = OVar29;
        if (uVar1 != '\0') {
          OVar10 = fVar37;
        }
        fVar37 = OVar10;
        OVar10 = OVar29;
        if (uVar1 != '\x06') {
          OVar10 = OVar85;
        }
        if (uVar1 != '\x03') {
          OVar29 = OVar63;
        }
        ptVar6 = ptVar6 + 1;
        OVar63 = OVar29;
        OVar85 = OVar10;
      } while (ptVar6 != ptVar2);
    }
    fVar34 = x->loss;
    fVar38 = 0.0;
    if (0.0 <= fVar34 - fVar37) {
      fVar38 = fVar34 - fVar37;
    }
    x->effective_deductible = (fVar34 - fVar38) + x->effective_deductible;
    fVar37 = 0.0;
    if (0.0 <= fVar38 - OVar29) {
      fVar37 = fVar38 - OVar29;
    }
    OVar10 = fVar37 * OVar10;
    if (layer < 2) {
      OVar29 = (fVar34 - OVar10) + x->retained_loss;
    }
    else {
      OVar29 = x->previous_layer_retained_loss - OVar10;
    }
    x->retained_loss = OVar29;
LAB_0010ce4a:
    x->loss = OVar10;
    return;
  case 0x25:
    ptVar6 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar2 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (ptVar6 == ptVar2) {
      fVar37 = x->loss;
      fVar102 = fVar37 / x->accumulated_tiv;
      fVar31 = 1.0;
      auVar16 = ZEXT816(0);
      fVar34 = 0.0;
      fVar38 = 0.0;
      fVar62 = 0.0;
      fVar103 = 0.0;
      fVar32 = 0.0;
      fVar33 = 0.0;
LAB_0010cc31:
      fVar104 = 0.0;
      if ((fVar102 < fVar103) && (fVar32 <= fVar102)) {
        fVar33 = fVar62 * fVar37 - fVar33;
        fVar37 = 0.0;
        if (0.0 <= fVar33) {
          fVar37 = fVar33;
        }
        if (fVar37 <= fVar34) {
          fVar34 = fVar37;
        }
LAB_0010cc54:
        if (fVar38 * fVar34 <= auVar16._0_4_) {
          auVar16._0_4_ = fVar38 * fVar34;
        }
        fVar104 = fVar31 * (auVar16._0_4_ + fVar34);
      }
    }
    else {
      auVar16 = ZEXT816(0);
      fVar62 = 0.0;
      fVar103 = 0.0;
      fVar32 = 0.0;
      fVar33 = 0.0;
      do {
        uVar36 = *(undefined4 *)&ptVar6->tc_id;
        uVar26 = (undefined1)((uint)uVar36 >> 0x18);
        uVar24 = (undefined1)((uint)uVar36 >> 0x10);
        uVar22 = (undefined1)((uint)uVar36 >> 8);
        auVar53._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar26,uVar26),uVar24),CONCAT14(uVar24,uVar36)) >>
                  0x20);
        auVar53[3] = uVar22;
        auVar53[2] = uVar22;
        auVar53[0] = (undefined1)uVar36;
        auVar53[1] = auVar53[0];
        auVar53._8_8_ = 0;
        auVar12 = pshuflw(auVar53,auVar53,0);
        uVar35 = CONCAT11(-(auVar12[0] == '\x05'),-(auVar12[0] == '\x05'));
        uVar36 = CONCAT13(-(auVar12[1] == '\x04'),CONCAT12(-(auVar12[1] == '\x04'),uVar35));
        uVar39 = CONCAT15(-(auVar12[2] == '\x0e'),CONCAT14(-(auVar12[2] == '\x0e'),uVar36));
        uVar40 = CONCAT17(-(auVar12[3] == '\r'),CONCAT16(-(auVar12[3] == '\r'),uVar39));
        auVar43._0_10_ = CONCAT19(-(auVar12[4] == '\v'),CONCAT18(-(auVar12[4] == '\v'),uVar40));
        auVar43[10] = -(auVar12[5] == '\n');
        auVar43[0xb] = -(auVar12[5] == '\n');
        auVar48[0xc] = -(auVar12[6] == '\t');
        auVar48._0_12_ = auVar43;
        auVar48[0xd] = -(auVar12[6] == '\t');
        auVar54[0xe] = -(auVar12[7] == '\0');
        auVar54._0_14_ = auVar48;
        auVar54[0xf] = -(auVar12[7] == '\0');
        uVar61 = (undefined2)((ulong)uVar40 >> 0x30);
        auVar74._12_2_ = uVar61;
        auVar74._0_12_ = auVar43;
        auVar74._14_2_ = uVar61;
        uVar61 = (undefined2)((uint6)uVar39 >> 0x20);
        auVar73._12_4_ = auVar74._12_4_;
        auVar73._10_2_ = uVar61;
        auVar73._0_10_ = auVar43._0_10_;
        auVar72._10_6_ = auVar73._10_6_;
        auVar72._8_2_ = uVar61;
        auVar72._0_8_ = uVar40;
        uVar61 = (undefined2)((uint)uVar36 >> 0x10);
        auVar71._8_8_ = auVar72._8_8_;
        auVar71._6_2_ = uVar61;
        auVar71._0_6_ = uVar39;
        auVar70._6_10_ = auVar71._6_10_;
        auVar70._4_2_ = uVar61;
        auVar70._0_4_ = uVar36;
        uVar61 = (undefined2)((unkuint10)auVar43._0_10_ >> 0x40);
        uVar9 = CONCAT22(uVar61,uVar61);
        auVar44._0_8_ = CONCAT26(auVar43._10_2_,CONCAT24(auVar43._10_2_,uVar9));
        auVar44._8_2_ = auVar48._12_2_;
        auVar44._10_2_ = auVar48._12_2_;
        auVar55._14_2_ = auVar54._14_2_;
        auVar55._12_2_ = auVar55._14_2_;
        auVar55._0_12_ = auVar44;
        OVar29 = ptVar6->tc_val;
        uVar28 = (uint)((ulong)auVar44._0_8_ >> 0x20);
        fVar62 = (float)(~uVar9 & (uint)fVar62 | (uint)OVar29 & uVar9);
        fVar103 = (float)(~uVar28 & (uint)fVar103 | (uint)OVar29 & uVar28);
        fVar32 = (float)(~auVar44._8_4_ & (uint)fVar32 | (uint)OVar29 & auVar44._8_4_);
        fVar33 = (float)(~auVar55._12_4_ & (uint)fVar33 | (uint)OVar29 & auVar55._12_4_);
        auVar92._0_4_ = (uint)OVar29 & CONCAT22(uVar35,uVar35);
        auVar92._4_4_ = (uint)OVar29 & auVar70._4_4_;
        auVar92._8_4_ = (uint)OVar29 & auVar72._8_4_;
        auVar92._12_4_ = (uint)OVar29 & auVar73._12_4_;
        auVar15._4_4_ = ~auVar70._4_4_ & auVar16._4_4_;
        auVar15._0_4_ = ~CONCAT22(uVar35,uVar35) & auVar16._0_4_;
        auVar15._8_4_ = ~auVar72._8_4_ & auVar16._8_4_;
        auVar15._12_4_ = ~auVar73._12_4_ & auVar16._12_4_;
        auVar16 = auVar15 | auVar92;
        ptVar6 = ptVar6 + 1;
      } while (ptVar6 != ptVar2);
      fVar34 = auVar16._4_4_;
      fVar38 = auVar16._8_4_;
      fVar31 = auVar16._12_4_ + 1.0;
      fVar37 = x->loss;
      fVar102 = fVar37 / x->accumulated_tiv;
      if ((fVar103 != 1.0) || (NAN(fVar103))) goto LAB_0010cc31;
      fVar104 = 0.0;
      if (fVar32 <= fVar102) {
        fVar33 = fVar37 * fVar62 - fVar33;
        fVar37 = 0.0;
        if (0.0 <= fVar33) {
          fVar37 = fVar33;
        }
        if (fVar37 <= fVar34) {
          fVar34 = fVar37;
        }
        goto LAB_0010cc54;
      }
    }
    if (profile->step_id != 1) {
      fVar104 = fVar104 + x->step_loss;
    }
    x->step_loss = fVar104;
    if (isLast) {
      x->loss = fVar104;
      return;
    }
    break;
  case 0x26:
    ptVar6 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar2 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (ptVar6 == ptVar2) {
      fVar62 = x->loss / x->accumulated_tiv;
      auVar21 = ZEXT816(0);
      fVar37 = 0.0;
      fVar34 = 0.0;
      fVar38 = 0.0;
      OVar29 = 0.0;
LAB_0010ce67:
      fVar33 = 0.0;
      if (fVar62 < fVar38) goto LAB_0010ce6f;
    }
    else {
      auVar21 = ZEXT816(0);
      auVar12 = ZEXT416(0xa0d0e05);
      cVar27 = auVar12[3];
      cVar25 = auVar12[2];
      cVar23 = auVar12[1];
      cVar7 = auVar12[0];
      OVar10 = 0.0;
      do {
        OVar63 = ptVar6->tc_val;
        uVar36 = *(undefined4 *)&ptVar6->tc_id;
        cVar8 = (char)uVar36;
        OVar29 = OVar63;
        if (cVar8 != '\t') {
          OVar29 = OVar10;
        }
        uVar26 = (undefined1)((uint)uVar36 >> 0x18);
        uVar24 = (undefined1)((uint)uVar36 >> 0x10);
        uVar22 = (undefined1)((uint)uVar36 >> 8);
        auVar80._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar26,uVar26),uVar24),CONCAT14(uVar24,uVar36)) >>
                  0x20);
        auVar80[3] = uVar22;
        auVar80[2] = uVar22;
        auVar80[1] = cVar8;
        auVar80[0] = cVar8;
        auVar80._8_8_ = 0;
        auVar12 = pshuflw(auVar80,auVar80,0);
        cVar84 = auVar12[3];
        cVar83 = auVar12[2];
        cVar82 = auVar12[1];
        cVar8 = auVar12[0];
        uVar9 = CONCAT13(-(cVar8 == cVar7),
                         CONCAT12(-(cVar8 == cVar7),CONCAT11(-(cVar8 == cVar7),-(cVar8 == cVar7))));
        auVar64._0_8_ =
             CONCAT17(-(cVar82 == cVar23),
                      CONCAT16(-(cVar82 == cVar23),
                               CONCAT15(-(cVar82 == cVar23),CONCAT14(-(cVar82 == cVar23),uVar9))));
        auVar64[8] = -(cVar83 == cVar25);
        auVar64[9] = -(cVar83 == cVar25);
        auVar64[10] = -(cVar83 == cVar25);
        auVar64[0xb] = -(cVar83 == cVar25);
        auVar81[0xc] = -(cVar84 == cVar27);
        auVar81._0_12_ = auVar64;
        auVar81[0xd] = -(cVar84 == cVar27);
        auVar81[0xe] = -(cVar84 == cVar27);
        auVar81[0xf] = -(cVar84 == cVar27);
        auVar60._0_4_ = (uint)OVar63 & uVar9;
        uVar28 = (uint)((ulong)auVar64._0_8_ >> 0x20);
        auVar60._4_4_ = (uint)OVar63 & uVar28;
        auVar60._8_4_ = (uint)OVar63 & auVar64._8_4_;
        auVar60._12_4_ = (uint)OVar63 & auVar81._12_4_;
        auVar20._4_4_ = ~uVar28 & auVar21._4_4_;
        auVar20._0_4_ = ~uVar9 & auVar21._0_4_;
        auVar20._8_4_ = ~auVar64._8_4_ & auVar21._8_4_;
        auVar20._12_4_ = ~auVar81._12_4_ & auVar21._12_4_;
        auVar21 = auVar20 | auVar60;
        ptVar6 = ptVar6 + 1;
        OVar10 = OVar29;
      } while (ptVar6 != ptVar2);
      fVar62 = x->loss / x->accumulated_tiv;
      fVar37 = auVar21._4_4_;
      fVar34 = auVar21._8_4_;
      fVar38 = auVar21._12_4_;
      if ((fVar38 != 1.0) || (NAN(fVar38))) goto LAB_0010ce67;
LAB_0010ce6f:
      fVar33 = 0.0;
      if (OVar29 <= fVar62) {
        fVar37 = fVar37 * x->step_loss;
        if (fVar37 <= auVar21._0_4_) {
          auVar21._0_4_ = fVar37;
        }
        fVar33 = fVar34 * (x->step_loss + auVar21._0_4_) + auVar21._0_4_;
      }
    }
    if (profile->step_id != 1) {
      fVar33 = fVar33 + x->step_loss;
    }
    x->step_loss = fVar33;
    if (isLast) {
      x->loss = fVar33;
    }
    break;
  default:
    if (uVar9 != 100) {
      if (uVar9 == 2) {
        ptVar6 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                 super__Vector_impl_data._M_start;
        ptVar2 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (ptVar6 == ptVar2) {
          fVar37 = 0.0;
          fVar34 = 0.0;
          fVar38 = 0.0;
          fVar62 = 0.0;
        }
        else {
          fVar37 = 0.0;
          fVar34 = 0.0;
          fVar38 = 0.0;
          fVar62 = 0.0;
          do {
            uVar36 = *(undefined4 *)&ptVar6->tc_id;
            uVar26 = (undefined1)((uint)uVar36 >> 0x18);
            uVar24 = (undefined1)((uint)uVar36 >> 0x10);
            uVar22 = (undefined1)((uint)uVar36 >> 8);
            auVar12._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar26,uVar26),uVar24),CONCAT14(uVar24,uVar36)) >>
                      0x20);
            auVar12[3] = uVar22;
            auVar12[2] = uVar22;
            auVar12[0] = (undefined1)uVar36;
            auVar12[1] = auVar12[0];
            auVar12._8_8_ = 0;
            auVar12 = pshuflw(auVar12,auVar12,0);
            cVar27 = auVar12[3];
            cVar25 = auVar12[2];
            cVar23 = auVar12[1];
            cVar7 = auVar12[0];
            uVar9 = CONCAT13(-(cVar7 == '\x06'),
                             CONCAT12(-(cVar7 == '\x06'),
                                      CONCAT11(-(cVar7 == '\x06'),-(cVar7 == '\x06'))));
            auVar11._0_8_ =
                 CONCAT17(-(cVar23 == '\0'),
                          CONCAT16(-(cVar23 == '\0'),
                                   CONCAT15(-(cVar23 == '\0'),CONCAT14(-(cVar23 == '\0'),uVar9))));
            auVar11[8] = -(cVar25 == '\x03');
            auVar11[9] = -(cVar25 == '\x03');
            auVar11[10] = -(cVar25 == '\x03');
            auVar11[0xb] = -(cVar25 == '\x03');
            auVar57[0xc] = -(cVar27 == '\x04');
            auVar57._0_12_ = auVar11;
            auVar57[0xd] = -(cVar27 == '\x04');
            auVar57[0xe] = -(cVar27 == '\x04');
            auVar57[0xf] = -(cVar27 == '\x04');
            OVar29 = ptVar6->tc_val;
            uVar28 = (uint)((ulong)auVar11._0_8_ >> 0x20);
            fVar37 = (float)(~uVar9 & (uint)fVar37 | (uint)OVar29 & uVar9);
            fVar34 = (float)(~uVar28 & (uint)fVar34 | (uint)OVar29 & uVar28);
            fVar38 = (float)(~auVar11._8_4_ & (uint)fVar38 | (uint)OVar29 & auVar11._8_4_);
            fVar62 = (float)(~auVar57._12_4_ & (uint)fVar62 | (uint)OVar29 & auVar57._12_4_);
            ptVar6 = ptVar6 + 1;
          } while (ptVar6 != ptVar2);
        }
        fVar33 = x->loss;
        fVar103 = 0.0;
        if (0.0 <= fVar33 - fVar34) {
          fVar103 = fVar33 - fVar34;
        }
        x->effective_deductible = (fVar33 - fVar103) + x->effective_deductible;
        uVar9 = -(uint)(fVar38 + fVar62 < fVar103);
        fVar38 = (float)(~uVar9 & (uint)(fVar103 - fVar38) | (uint)fVar62 & uVar9);
        fVar34 = 0.0;
        if (0.0 <= fVar38) {
          fVar34 = fVar38;
        }
        fVar34 = fVar34 * fVar37;
        goto joined_r0x0010cf0b;
      }
      goto switchD_0010c310_caseD_d;
    }
  }
  return;
}

Assistant:

void applycalcrule_stepped(const profile_rec_new& profile, LossRec& x, int layer,bool isLast)
{
	switch (profile.calcrule_id) {
	case 2:
	{
		OASIS_FLOAT ded = 0;
		OASIS_FLOAT lim = 0;
		OASIS_FLOAT share = 0;
		OASIS_FLOAT att = 0;
		for (auto y : profile.tc_vec) {
			if (y.tc_id == deductible_1) ded = y.tc_val;
			if (y.tc_id == limit_1) lim = y.tc_val;
			if (y.tc_id == share_1) share = y.tc_val;
			if (y.tc_id == attachment_1) att = y.tc_val;
		}
		//Function2: deductible applies before attachment limit share
		//IIf(Loss < Ded, 0, Loss - Ded)
		//IIf(Loss < Att, 0, IIf(Loss > Att + Lim, Lim, Loss - Att)) * Share	
		OASIS_FLOAT loss = 0;
		loss = x.loss - ded;
		if (loss < 0) loss = 0;
		x.effective_deductible = x.effective_deductible + (x.loss - loss);
		if (loss > (att + lim)) loss = lim;
		else loss = loss - att;
		if (loss < 0) loss = 0;
		loss = loss * share;
		//x.retained_loss = x.retained_loss + (x.loss - loss);
		OASIS_FLOAT net_loss = 0;
		if (layer > 1)	net_loss = x.previous_layer_retained_loss - loss;
		else net_loss = x.retained_loss + (x.loss - loss);
		x.retained_loss = net_loss;

		x.loss = loss;
	}
	break;
	case 12:
	{
		if (x.loss > 0) {
			for (auto& z : profile.tc_vec) {
				if (z.tc_id == deductible_1) {
					OASIS_FLOAT loss = x.loss - z.tc_val;
					if (loss < 0) loss = 0;
					x.effective_deductible = x.effective_deductible + (x.loss - loss);
					if (x.effective_deductible > x.under_limit) x.under_limit = x.effective_deductible;
					x.retained_loss = x.retained_loss + (x.loss - loss);
					x.loss = loss;
					break;
				}
			}
		}
	}
	break;
	case 14:
	{
		OASIS_FLOAT lim = 0;
		for (auto y : profile.tc_vec) {
			if (y.tc_id == limit_1) lim = y.tc_val;
		}
		//Function14 =  IIf(Loss > lim, Lim, Loss)
		OASIS_FLOAT loss = x.loss;
			if (loss > lim) {
				x.over_limit = loss - lim;
				loss = lim;
			}
		OASIS_FLOAT under_limit = 0;
		under_limit = x.under_limit;
		if (x.effective_deductible > under_limit) under_limit = x.effective_deductible;
		if (lim - loss < under_limit) under_limit = lim - loss;
		x.under_limit = under_limit;
		//x.retained_loss = x.retained_loss + (x.loss - loss);
		OASIS_FLOAT net_loss = 0;
		if (layer > 1)	net_loss = x.previous_layer_retained_loss - loss;
		else net_loss = x.retained_loss + (x.loss - loss);
		x.retained_loss = net_loss;
		x.loss = loss;
	}
	break;
	case 27:
	{
		OASIS_FLOAT deductible1 = 0;
		OASIS_FLOAT tstart = 0;
		OASIS_FLOAT tend = 0;
		OASIS_FLOAT payout = 0;
		OASIS_FLOAT scale1 = 0;
		OASIS_FLOAT scale2 = 0;
		OASIS_FLOAT limit1 = 0;
		OASIS_FLOAT limit2 = 0;
		for (auto y : profile.tc_vec) {
			if (y.tc_id == deductible_1) deductible1 = y.tc_val;
			if (y.tc_id == trigger_start) tstart = y.tc_val;
			if (y.tc_id == trigger_end) tend = y.tc_val;
			if (y.tc_id == payout_start) payout = y.tc_val;
			if (y.tc_id == scale_1) scale1 = y.tc_val;
			if (y.tc_id == scale_2) scale2 = y.tc_val;
			if (y.tc_id == limit_1) limit1 = y.tc_val;
			if (y.tc_id == limit_2) limit2 = y.tc_val;

		}
		// Step policy: single step with % loss tiv payout and limit, optional deductible, extra expense payout with limit amount, and a gross up factor for debris removal
		OASIS_FLOAT loss = 0;
		OASIS_FLOAT condloss = 0;
		loss = x.loss / x.accumulated_tiv;
		if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
			if (loss >= tstart) {
				loss = (payout * x.accumulated_tiv) - deductible1; //calculate primary payout
				if (loss < 0) loss = 0;
				if (loss > limit1) loss = limit1;
				condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
				if (condloss > limit2) condloss = limit2; //limit conditional payout
				loss = loss + condloss; // main coverage + extra expense payout
				loss = loss * (1 + scale1); // gross up for debris removal
			}
				else loss = 0;
		}
		else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
			if (loss < tend) {
				if (loss >= tstart) {
					loss = (payout * x.accumulated_tiv) - deductible1; //calculate primary payout
					if (loss < 0) loss = 0;
					if (loss > limit1) loss = limit1;
					condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					loss = loss + condloss; // main coverage + extra expense payout
					loss = loss * (1 + scale1); // gross up for debris removal
				}
				else loss = 0;
			}
			else loss = 0;
		}

		if (profile.step_id == 1) {
			x.step_loss = loss;
		}
		else {
			x.step_loss = x.step_loss + loss;
		}
		if (isLast == true) {
			x.loss = x.step_loss;
		}
	}
	break;
		case 28:
		{		
			OASIS_FLOAT deductible1 = 0;
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT tend = 0;
			OASIS_FLOAT payout = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit2 = 0;
			

			for (auto y : profile.tc_vec) {
				if (y.tc_id == deductible_1) deductible1 = y.tc_val;
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == trigger_end) tend = y.tc_val;
				if (y.tc_id == payout_start) payout = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;				
			}
			// Step policy: single (final) step with % loss payout, no limit, extra expense payout with limit amount, and a gross up factor for debris removal
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT condloss = 0;
			loss = x.loss / x.accumulated_tiv;
			if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
				if (loss >= tstart) {
					loss = (payout * x.loss) - deductible1; //calculate primary payout
					if (loss < 0) loss = 0;
					condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					loss = loss + condloss; // main coverage + extra expense payout
					loss = loss * (1 + scale1); // gross up for debris removal
				}
					else loss = 0;
			}
			else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
				if (loss < tend) {
					if (loss >= tstart) {
						loss = (payout * x.loss) - deductible1; //calculate primary payout
						if (loss < 0) loss = 0;
						condloss = loss * scale2; //calculate conditional payout (extra expenses)
						if (condloss > limit2) condloss = limit2; //limit conditional payout
						loss = loss + condloss; // main coverage + extra expense payout
						loss = loss * (1 + scale1); // gross up for debris removal
					}
					else loss = 0;
				}
				else loss = 0;
			}
			
			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}
		}
		break;
		case 29:
		{
			OASIS_FLOAT deductible1 = 0;
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT tend = 0;
			OASIS_FLOAT payout = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit2 = 0;
			for (auto y : profile.tc_vec) {
				if (y.tc_id == deductible_1) deductible1 = y.tc_val;
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == trigger_end) tend = y.tc_val;
				if (y.tc_id == payout_start) payout = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;

			}
			// Step policy: single step with % loss tiv payout, no limit, optional deductible, extra expense payout with limit amount, and a gross up factor for debris removal
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT condloss = 0;
			loss = x.loss / x.accumulated_tiv;
			if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
				if (loss >= tstart) {
					loss = (payout * x.accumulated_tiv) - deductible1; //calculate primary payout
					if (loss < 0) loss = 0;
					condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					loss = loss + condloss; // main coverage + extra expense payout
					loss = loss * (1 + scale1); // gross up for debris removal
				}
					else loss = 0;
			}
			else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
				if (loss < tend) {
					if (loss >= tstart) {
						loss = (payout * x.accumulated_tiv) - deductible1; //calculate primary payout
						if (loss < 0) loss = 0;
						condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
						if (condloss > limit2) condloss = limit2; //limit conditional payout
						loss = loss + condloss; // main coverage + extra expense payout
						loss = loss * (1 + scale1); // gross up for debris removal
					}
					else loss = 0;
				}
				else loss = 0;
			}

			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}
		}
		break;
		case 30:
		{
			OASIS_FLOAT deductible1 = 0;
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT tend = 0;
			OASIS_FLOAT payout = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit1 = 0;
			OASIS_FLOAT limit2 = 0;
			for (auto y : profile.tc_vec) {
				if (y.tc_id == deductible_1) deductible1 = y.tc_val;
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == trigger_end) tend = y.tc_val;
				if (y.tc_id == payout_start) payout = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_1) limit1 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;

			}
			// Step policy: single step with % limit payout, optional deductible, extra expense payout with limit amount, and a gross up factor for debris removal
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT condloss = 0;
			loss = x.loss / x.accumulated_tiv;
			if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
				if (loss >= tstart) {
					loss = (payout * limit1) - deductible1; //calculate primary payout
					if (loss < 0) loss = 0;
					condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					loss = loss + condloss; // main coverage + extra expense payout
					loss = loss * (1 + scale1); // gross up for debris removal
				}
					else loss = 0;
			}
			else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
				if (loss < tend) {
					if (loss >= tstart) {
						loss = (payout * limit1) - deductible1; //calculate primary payout
						if (loss < 0) loss = 0;
						condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
						if (condloss > limit2) condloss = limit2; //limit conditional payout
						loss = loss + condloss; // main coverage + extra expense payout
						loss = loss * (1 + scale1); // gross up for debris removal
					}
					else loss = 0;
				}
				else loss = 0;
			}

			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}
		}
		break;
		case 31:
		{
			OASIS_FLOAT deductible1 = 0;
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT tend = 0;
			OASIS_FLOAT payout = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit2 = 0;
			for (auto y : profile.tc_vec) {
				if (y.tc_id == deductible_1) deductible1 = y.tc_val;
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == trigger_end) tend = y.tc_val;
				if (y.tc_id == payout_start) payout = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;

			}
			// Step policy: single step with monetary amount payout, optional deductible, extra expense payout with limit amount, and a gross up factor for debris removal
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT condloss = 0;
			loss = x.loss / x.accumulated_tiv;
			if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
				if (loss >= tstart) {
					loss = payout - deductible1; //calculate primary payout
					if (loss < 0) loss = 0;
					condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					loss = loss + condloss; // main coverage + extra expense payout
					loss = loss * (1 + scale1); // gross up for debris removal
				}
					else loss = 0;
			}
			else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
				if (loss < tend) {
					if (loss >= tstart) {
						loss = payout - deductible1; //calculate primary payout
						if (loss < 0) loss = 0;
						condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
						if (condloss > limit2) condloss = limit2; //limit conditional payout
						loss = loss + condloss; // main coverage + extra expense payout
						loss = loss * (1 + scale1); // gross up for debris removal
					}
					else loss = 0;
				}
				else loss = 0;
			}

			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}
		}
		break;
		case 32:
		{
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT payout = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT limit1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit2 = 0;

			for (auto y : profile.tc_vec) {
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == payout_start) payout = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == limit_1) limit1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;
			}
			// Step policy: franchise trigger as a monetary amount with % loss payout, a limit amount and optional extra expenses and scale up factor for debris removal
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT condloss = 0;
			if (x.loss >= tstart) {
				loss = payout * x.loss;
				if (loss > limit1) loss = limit1;
				condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
				if (condloss > limit2) condloss = limit2; //limit conditional payout
				loss = loss + condloss; // main coverage + extra expense payout
				loss = loss * (1 + scale1);
			}
			else loss = 0;
			
			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}


		}
		break;
		case 34:
		{
			OASIS_FLOAT ded = 0;
			OASIS_FLOAT share = 0;
			OASIS_FLOAT att = 0;
			for (auto y : profile.tc_vec) {
				if (y.tc_id == deductible_1) ded = y.tc_val;
				if (y.tc_id == share_1) share = y.tc_val;
				if (y.tc_id == attachment_1) att = y.tc_val;
			}
			//Function2: deductible applies before attachment limit share
			//IIf(Loss < Ded, 0, Loss - Ded)
			//IIf(Loss < Att, 0, IIf(Loss > Att + Lim, Lim, Loss - Att)) * Share	
			OASIS_FLOAT loss = 0;
			loss = x.loss - ded;
			if (loss < 0) loss = 0;
			x.effective_deductible = x.effective_deductible + (x.loss - loss);
			loss = loss - att;
			if (loss < 0) loss = 0;
			loss = loss * share;
			//x.retained_loss = x.retained_loss + (x.loss - loss);
			OASIS_FLOAT net_loss = 0;
			if (layer > 1)	net_loss = x.previous_layer_retained_loss - loss;
			else net_loss = x.retained_loss + (x.loss - loss);
			x.retained_loss = net_loss;
			x.loss = loss;
		}
		break;
		case 37:
		{
			OASIS_FLOAT deductible1 = 0;
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT tend = 0;
			OASIS_FLOAT payout = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit1 = 0;
			OASIS_FLOAT limit2 = 0;


			for (auto y : profile.tc_vec) {
				if (y.tc_id == deductible_1) deductible1 = y.tc_val;
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == trigger_end) tend = y.tc_val;
				if (y.tc_id == payout_start) payout = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_1) limit1 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;
			}
			// Step policy: single (final) step with % loss payout and limit, extra expense payout with limit amount, and a gross up factor for debris removal
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT condloss = 0;
			loss = x.loss / x.accumulated_tiv;
			if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
				if (loss >= tstart) {
					loss = (payout * x.loss) - deductible1; //calculate primary payout
					if (loss < 0) loss = 0;
					if (loss > limit1) loss = limit1;
					condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					loss = loss + condloss; // main coverage + extra expense payout
					loss = loss * (1 + scale1); // gross up for debris removal
				}
				else loss = 0;
			}
			else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
				if (loss < tend) {
					if (loss >= tstart) {
						loss = (payout * x.loss) - deductible1; //calculate primary payout
						if (loss < 0) loss = 0;
						if (loss > limit1) loss = limit1;
						condloss = loss * scale2; //calculate conditional payout (extra expenses)
						if (condloss > limit2) condloss = limit2; //limit conditional payout
						loss = loss + condloss; // main coverage + extra expense payout
						loss = loss * (1 + scale1); // gross up for debris removal
					}
					else loss = 0;
				}
				else loss = 0;
			}

			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}
		}
		break;
		case 38:
		{
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT tend = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit2 = 0;


			for (auto y : profile.tc_vec) {
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == trigger_end) tend = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;
			}
			// Step policy: conditional payouts only, triggered by loss % TIV.  Extra expense payout with limit amount, and a gross up factor for debris removal, with payout based on prior step payout
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT trigger = 0;
			OASIS_FLOAT condloss = 0;
			OASIS_FLOAT debrisloss = 0;
			trigger = x.loss / x.accumulated_tiv;
			if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
				if (trigger >= tstart) {
					condloss = x.step_loss * scale2; //calculate conditional payout based on prior step payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					debrisloss = (x.step_loss + condloss) * scale1; // debris removal uplift
					loss = condloss + debrisloss; // payout is conditional loss for extra expenses plus full debris removal uplift
				}
				else loss = 0;
			}
			else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
				if (trigger < tend) {
					if (trigger >= tstart) {
						condloss = x.step_loss * scale2; //calculate conditional payout based on prior step payout (extra expenses)
						if (condloss > limit2) condloss = limit2; //limit conditional payout
						debrisloss = (x.step_loss + condloss) * scale1; // debris removal uplift
						loss = condloss + debrisloss; // payout is conditional loss for extra expenses plus full debris removal uplift
					}
					else loss = 0;
				}
				else loss = 0;
			}

			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}
		}
		break;
		case 100:	// noop
		{
			x.loss = x.loss;
		}
		break;
		default:
		{
			fprintf(stderr, "FATAL: Unknown calc rule %d\n", profile.calcrule_id);
		}
	}
}